

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python-puppet.hpp
# Opt level: O0

void henson::PythonPuppet::exec(void *self_)

{
  time_type tVar1;
  list *plVar2;
  long in_RDI;
  error_already_set *e;
  exception *e_1;
  object locals;
  value_type *arg;
  size_t i;
  list argv;
  PythonPuppet *self;
  object *in_stack_fffffffffffffdf8;
  handle in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  str *in_stack_fffffffffffffe10;
  accessor<pybind11::detail::accessor_policies::str_attr> *in_stack_fffffffffffffe18;
  list *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  byte in_stack_fffffffffffffe2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
  *in_stack_fffffffffffffe38;
  object local_180;
  object local_178 [2];
  undefined1 in_stack_fffffffffffffe9f;
  char *in_stack_fffffffffffffea0;
  module_ *in_stack_fffffffffffffea8;
  handle in_stack_fffffffffffffeb0;
  list *local_128;
  object *in_stack_ffffffffffffff18;
  object *in_stack_ffffffffffffff20;
  str *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long local_68;
  long local_60;
  long local_58;
  
  *(long *)(in_RDI + 0xb8) = in_RDI;
  local_60 = in_RDI;
  local_58 = in_RDI;
  do {
    local_68 = local_58;
    args = &local_90;
    pybind11::module_::import((char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28))
    ;
    pybind11::detail::object_api<pybind11::handle>::attr
              ((object_api<pybind11::handle> *)in_stack_fffffffffffffe18,
               (char *)in_stack_fffffffffffffe10);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)args,
               (long *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2eab4e);
    pybind11::module_::~module_((module_ *)0x2eab5b);
    *(undefined1 *)(local_60 + 0x20) = 1;
    tVar1 = get_time();
    *(time_type *)(local_60 + 0x30) = tVar1;
    pybind11::list::list<long,_0>(in_stack_fffffffffffffe20,(long)in_stack_fffffffffffffe18);
    pybind11::module_::import((char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28))
    ;
    in_stack_fffffffffffffe2f =
         pybind11::hasattr(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
    pybind11::module_::~module_((module_ *)0x2eabdb);
    if ((in_stack_fffffffffffffe2f & 1) == 0) {
      pybind11::module_::import
                ((char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      pybind11::module_::add_object
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffeb0,
                 (bool)in_stack_fffffffffffffe9f);
      pybind11::module_::~module_((module_ *)0x2eadb1);
    }
    else {
      pybind11::module_::import
                ((char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      pybind11::detail::object_api<pybind11::handle>::attr
                ((object_api<pybind11::handle> *)in_stack_fffffffffffffe18,
                 (char *)in_stack_fffffffffffffe10);
      pybind11::list::list<pybind11::detail::accessor_policies::str_attr>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      pybind11::list::operator=
                ((list *)in_stack_fffffffffffffe00.m_ptr,(list *)in_stack_fffffffffffffdf8);
      pybind11::list::~list((list *)0x2eac55);
      pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2eac62);
      pybind11::module_::~module_((module_ *)0x2eac6f);
    }
    pybind11::detail::object_api<pybind11::handle>::attr
              ((object_api<pybind11::handle> *)in_stack_fffffffffffffe18,
               (char *)in_stack_fffffffffffffe10);
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
                *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    pybind11::object::~object((object *)0x2eae1b);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2eae28);
    local_128 = (list *)0x0;
    while( true ) {
      in_stack_fffffffffffffe20 = local_128;
      plVar2 = (list *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_60 + 0xa0));
      if (plVar2 <= in_stack_fffffffffffffe20) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_60 + 0xa0),(size_type)local_128);
      pybind11::detail::object_api<pybind11::handle>::attr
                ((object_api<pybind11::handle> *)in_stack_fffffffffffffe18,
                 (char *)in_stack_fffffffffffffe10);
      pybind11::detail::
      object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
      operator()(in_stack_fffffffffffffe38,args);
      pybind11::object::~object((object *)0x2eaed4);
      pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2eaee1);
      local_128 = (list *)((long)&(local_128->super_object).super_handle.m_ptr + 1);
    }
    pybind11::object::object((object *)0x2eaf53);
    pybind11::str::str(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    pybind11::globals();
    pybind11::object::object(local_178,&local_180);
    pybind11::object::object((object *)in_stack_fffffffffffffe00.m_ptr,in_stack_fffffffffffffdf8);
    pybind11::eval_file<(pybind11::eval_mode)2>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    pybind11::object::~object((object *)0x2eafdd);
    pybind11::object::~object((object *)0x2eafea);
    pybind11::object::~object((object *)0x2eaff7);
    pybind11::dict::~dict((dict *)0x2eb004);
    pybind11::str::~str((str *)0x2eb011);
    pybind11::object::~object((object *)0x2eb01e);
    pybind11::list::~list((list *)0x2eb02b);
    *(undefined1 *)(local_60 + 0x20) = 0;
    Coroutine<henson::PythonPuppet>::yield((Coroutine<henson::PythonPuppet> *)0x2eb1ff);
  } while( true );
}

Assistant:

static void         exec(void* self_)
    {
        PythonPuppet* self = (PythonPuppet*) self_;
        self->self = self;

        while(true)
        {
            {
                // we can have only one PythonPuppet (otherwise scoped_interpreter
                // will complain), so there is only one pyhenson module, with only
                // one self to modify
                py::module::import("pyhenson").attr("self") = reinterpret_cast<intptr_t>(self_);

                self->running_ = true;
                self->start_time_ = get_time();
                try
                {
                    py::list argv;
                    if (py::hasattr(py::module::import("sys"), "argv")) {
                        argv = py::module::import("sys").attr("argv");
                    } else {
                        py::module::import("sys").add_object("argv", argv);
                    }
                    argv.attr("clear")();
                    for(size_t i = 0; i < self->arguments_.size(); ++i)
                    {
                        auto& arg = self->arguments_[i];
                        argv.attr("append")(arg);
                    }

                    py::object locals;
                    py::eval_file(self->filename_, py::globals(), locals);
                } catch (const py::error_already_set& e)
                {
                    self->log_->info("Caught error_already_set (maybe SystemExit; check debug channel for details)");
                    self->log_->debug("  {}", e.what());
                }
                catch (const std::exception& e)
                {
                    self->log_->warn("Got exception from Python: {}", e.what());
                }
                self->running_ = false;
            }

            self->yield();      // the time for the final portion will get recorded thanks to this call
        }
    }